

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedDnaSequence.cpp
# Opt level: O0

void __thiscall NamedDnaSequence::append(NamedDnaSequence *this,string *s)

{
  bool bVar1;
  byte bVar2;
  reference pcVar3;
  byte *pbVar4;
  NamedDnaSequence *in_RDI;
  const_iterator it;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18 [3];
  
  local_18[0]._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    if ((in_RDI->length & 1) == 0) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(local_18);
      encode(in_RDI,*pcVar3);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (value_type_conflict6 *)in_stack_ffffffffffffffb8);
    }
    else {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(local_18);
      bVar2 = encode(in_RDI,*pcVar3);
      in_stack_ffffffffffffffc4 = (uint)bVar2 << 4;
      pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&in_RDI->sequence,in_RDI->length >> 1);
      *pbVar4 = *pbVar4 | (byte)in_stack_ffffffffffffffc4;
    }
    in_RDI->length = in_RDI->length + 1;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_18);
  }
  return;
}

Assistant:

void NamedDnaSequence::append(const string& s) {
	string::const_iterator it = s.begin();
	for (;it!=s.end(); ++it) {
		if (length % 2 == 0) {
			sequence.push_back(encode(*it));
		} else {
			sequence[length/2] |= encode(*it)<<4;
		}
		length += 1;
	}
}